

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multithread_futures.cpp
# Opt level: O3

int main(void)

{
  pointer pfVar1;
  uint uVar2;
  int iVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Result<int> *this;
  ostream *poVar5;
  __sighandler_t __handler;
  int iVar6;
  _State_baseV2 *__tmp;
  future<int> *f;
  pointer this_00;
  shared_ptr<std::__future_base::_State_baseV2> __state;
  vector<std::future<int>,_std::allocator<std::future<int>_>_> futures;
  signal<void_()> sig;
  long *local_100;
  __state_type local_f8;
  vector<std::future<int>,_std::allocator<std::future<int>_>_> local_e8;
  _func_int **local_d0;
  _func_int **local_c8 [2];
  __basic_future<int> local_b8;
  signal<void_()> local_a8;
  
  local_a8.super_signal_base._vptr_signal_base = (_func_int **)&PTR__signal_00107b10;
  local_a8.m_slots.m_mutex_nodes.super___mutex_base._M_mutex.__align = 0;
  local_a8.m_slots.m_mutex_nodes.super___mutex_base._M_mutex._8_8_ = 0;
  local_a8.m_slots.m_mutex_nodes.super___mutex_base._M_mutex._16_8_ = 0;
  local_a8.m_slots.m_mutex_nodes.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  local_a8.m_slots.m_mutex_nodes.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  local_a8.m_slots.m_first._0_5_ = 0;
  local_a8.m_slots.m_first._5_3_ = 0;
  local_a8.m_slots.m_last._0_5_ = 0;
  local_a8.m_slots._53_8_ = 0;
  std::condition_variable::condition_variable(&local_a8.m_slots.m_delete_cv);
  local_d0 = (_func_int **)time((time_t *)0x0);
  local_e8.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (future<int> *)0x0;
  local_e8.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (future<int> *)0x0;
  local_e8.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar2 = std::thread::hardware_concurrency();
  iVar6 = (uVar2 >> 1) + (uint)(uVar2 >> 1 == 0);
  do {
    local_f8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_f8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
    p_Var4->_M_use_count = 1;
    p_Var4->_M_weak_count = 1;
    p_Var4->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00107b60;
    p_Var4[1]._M_use_count = 0;
    p_Var4[1]._M_weak_count = 0;
    *(undefined4 *)&p_Var4[2]._vptr__Sp_counted_base = 0;
    *(undefined1 *)((long)&p_Var4[2]._vptr__Sp_counted_base + 4) = 0;
    p_Var4[2]._M_use_count = 0;
    p_Var4[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var4[3]._M_use_count = 0;
    p_Var4[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_00107bb0;
    this = (_Result<int> *)operator_new(0x18);
    std::__future_base::_Result<int>::_Result(this);
    p_Var4[4]._vptr__Sp_counted_base = (_func_int **)this;
    *(signal<void_()> **)&p_Var4[4]._M_use_count = &local_a8;
    p_Var4[5]._vptr__Sp_counted_base = local_d0;
    local_c8[0] = (_func_int **)0x0;
    local_100 = (long *)operator_new(0x20);
    *local_100 = (long)&PTR___State_00107c18;
    local_100[1] = (long)(p_Var4 + 1);
    local_100[2] = (long)std::__future_base::
                         _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/multithread_futures.cpp:21:5)>_>,_int>
                         ::_M_run;
    local_100[3] = 0;
    std::thread::_M_start_thread(local_c8,&local_100,0);
    if (local_100 != (long *)0x0) {
      (**(code **)(*local_100 + 8))();
    }
    if (p_Var4[3]._vptr__Sp_counted_base != (_func_int **)0x0) {
      std::terminate();
    }
    p_Var4[3]._vptr__Sp_counted_base = local_c8[0];
    local_f8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)(p_Var4 + 1);
    local_f8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var4;
    std::__basic_future<int>::__basic_future(&local_b8,&local_f8);
    if (local_f8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_f8.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::vector<std::future<int>,std::allocator<std::future<int>>>::emplace_back<std::future<int>>
              ((vector<std::future<int>,std::allocator<std::future<int>>> *)&local_e8,
               (future<int> *)&local_b8);
    if (local_b8._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b8._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    pfVar1 = local_e8.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  iVar6 = 0;
  for (this_00 = local_e8.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start; this_00 != pfVar1; this_00 = this_00 + 1)
  {
    iVar3 = std::future<int>::get(this_00);
    iVar6 = iVar6 + iVar3;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Count = ",8);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar6);
  iVar6 = 0x105029;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  std::vector<std::future<int>,_std::allocator<std::future<int>_>_>::~vector(&local_e8);
  obs::signal<void_()>::~signal(&local_a8,iVar6,__handler);
  return 0;
}

Assistant:

int main() {
  obs::signal<void()> sig;
  std::time_t t = std::time(nullptr);

  auto func =
    [&sig, t](){
      int count = 0;
      while ((std::time(nullptr) - t) < 5) {
        std::vector<obs::scoped_connection> conns(32);
        for (auto& conn : conns) {
          conn = sig.connect([](){ });
          ++count;
          if (std::time(nullptr) - t >= 5)
            break;
        }
      }
      return count;
    };

  std::vector<std::future<int>> futures;
  int n = std::max<int>(1, std::thread::hardware_concurrency()/2);
  while (n--)
    futures.emplace_back(std::async(std::launch::async, func));

  int count = 0;
  for (auto& f : futures)
    count += f.get();

  std::cout << "Count = " << count << "\n";
  return 0;
}